

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined8 uVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  uint uVar28;
  undefined4 uVar29;
  int *piVar30;
  long *plVar31;
  _func_int *p_Var32;
  size_t sVar33;
  size_t sVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  Layer *pLVar39;
  long lVar40;
  void *pvVar41;
  ulong uVar42;
  int j;
  int iVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  void *pvVar47;
  void *pvVar48;
  int i_1;
  int iVar49;
  undefined4 *puVar50;
  int iVar51;
  long lVar52;
  int iVar53;
  ulong uVar54;
  uint uVar55;
  ulong uVar56;
  int j_1;
  int iVar57;
  undefined8 *puVar58;
  float fVar59;
  float fVar60;
  Option opt_cpu;
  ParamDict pd;
  ulong local_670;
  void *local_640;
  undefined8 local_608;
  Allocator *pAStack_600;
  Allocator *local_5f8;
  ulong uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  ParamDict local_5d8;
  
  local_608._0_1_ = opt->lightmode;
  local_608._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_608._4_4_ = opt->num_threads;
  pAStack_600 = opt->blob_allocator;
  local_5f8 = opt->workspace_allocator;
  uStack_5f0._0_1_ = opt->vulkan_compute;
  uStack_5f0._1_3_ = *(undefined3 *)&opt->field_0x19;
  uStack_5f0._4_4_ = opt->use_winograd_convolution;
  local_5e8._0_4_ = opt->use_sgemm_convolution;
  local_5e8._4_4_ = opt->use_int8_inference;
  uStack_5f0 = uStack_5f0 & 0xffffffffffffff00;
  switch(*(undefined4 *)(&this->field_0xb0 + (long)this->_vptr_Convolution_x86[-3])) {
  case 1:
    pLVar39 = create_layer(0x1a);
    this->activation = pLVar39;
    ParamDict::ParamDict(&local_5d8);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_5d8);
    lVar45 = 0x560;
    do {
      piVar30 = *(int **)((long)&local_5d8.params[0].v.data + lVar45);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          pvVar47 = *(void **)((long)&local_5d8.params[0].loaded + lVar45);
          plVar31 = *(long **)((long)&local_5d8.params[0].v.packing + lVar45);
          if (plVar31 == (long *)0x0) {
            if (pvVar47 != (void *)0x0) {
              free(pvVar47);
            }
          }
          else {
            (**(code **)(*plVar31 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_5d8.params[0].v.data + lVar45 + 4) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.refcount + lVar45 + 4) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].loaded + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.data + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.allocator + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.dims + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.h + lVar45) = 0;
      lVar45 = lVar45 + -0x48;
    } while (lVar45 != -0x40);
    break;
  case 2:
    pLVar39 = create_layer(0x1a);
    this->activation = pLVar39;
    ParamDict::ParamDict(&local_5d8);
    ParamDict::set(&local_5d8,0,
                   **(float **)(&this->field_0xb8 + (long)this->_vptr_Convolution_x86[-3]));
    (*this->activation->_vptr_Layer[2])(this->activation,&local_5d8);
    lVar45 = 0x560;
    do {
      piVar30 = *(int **)((long)&local_5d8.params[0].v.data + lVar45);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          pvVar47 = *(void **)((long)&local_5d8.params[0].loaded + lVar45);
          plVar31 = *(long **)((long)&local_5d8.params[0].v.packing + lVar45);
          if (plVar31 == (long *)0x0) {
            if (pvVar47 != (void *)0x0) {
              free(pvVar47);
            }
          }
          else {
            (**(code **)(*plVar31 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_5d8.params[0].v.data + lVar45 + 4) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.refcount + lVar45 + 4) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].loaded + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.data + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.allocator + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.dims + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.h + lVar45) = 0;
      lVar45 = lVar45 + -0x48;
    } while (lVar45 != -0x40);
    break;
  case 3:
    pLVar39 = create_layer(0x36);
    this->activation = pLVar39;
    ParamDict::ParamDict(&local_5d8);
    ParamDict::set(&local_5d8,0,
                   **(float **)(&this->field_0xb8 + (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&local_5d8,1,
                   *(float *)(*(long *)(&this->field_0xb8 + (long)this->_vptr_Convolution_x86[-3]) +
                             4));
    (*this->activation->_vptr_Layer[2])(this->activation,&local_5d8);
    lVar45 = 0x560;
    do {
      piVar30 = *(int **)((long)&local_5d8.params[0].v.data + lVar45);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          pvVar47 = *(void **)((long)&local_5d8.params[0].loaded + lVar45);
          plVar31 = *(long **)((long)&local_5d8.params[0].v.packing + lVar45);
          if (plVar31 == (long *)0x0) {
            if (pvVar47 != (void *)0x0) {
              free(pvVar47);
            }
          }
          else {
            (**(code **)(*plVar31 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_5d8.params[0].v.data + lVar45 + 4) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.refcount + lVar45 + 4) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].loaded + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.data + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.allocator + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.dims + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.h + lVar45) = 0;
      lVar45 = lVar45 + -0x48;
    } while (lVar45 != -0x40);
    break;
  case 4:
    pLVar39 = create_layer(0x1e);
    this->activation = pLVar39;
    ParamDict::ParamDict(&local_5d8);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_5d8);
    lVar45 = 0x560;
    do {
      piVar30 = *(int **)((long)&local_5d8.params[0].v.data + lVar45);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          pvVar47 = *(void **)((long)&local_5d8.params[0].loaded + lVar45);
          plVar31 = *(long **)((long)&local_5d8.params[0].v.packing + lVar45);
          if (plVar31 == (long *)0x0) {
            if (pvVar47 != (void *)0x0) {
              free(pvVar47);
            }
          }
          else {
            (**(code **)(*plVar31 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_5d8.params[0].v.data + lVar45 + 4) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.refcount + lVar45 + 4) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].loaded + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.data + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.allocator + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.dims + lVar45) = 0;
      *(undefined8 *)((long)&local_5d8.params[0].v.h + lVar45) = 0;
      lVar45 = lVar45 + -0x48;
    } while (lVar45 != -0x40);
  }
  pLVar39 = this->activation;
  if (pLVar39 != (Layer *)0x0) {
    (*pLVar39->_vptr_Layer[4])(pLVar39,&local_608);
  }
  this->use_winograd3x3 = false;
  if ((((((opt->use_winograd_convolution != 0) &&
         (p_Var32 = this->_vptr_Convolution_x86[-3],
         *(int *)((long)&(this->weight_sgemm_data).w + (long)p_Var32) == 3)) &&
        (*(int *)((long)&(this->weight_sgemm_data).h + (long)p_Var32) == 3)) &&
       ((*(int *)((long)&(this->weight_sgemm_data).c + (long)p_Var32) == 1 &&
        (*(int *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var32) == 1)))) &&
      ((*(int *)((long)&(this->weight_sgemm_data).cstep + (long)(p_Var32 + 4)) == 1 &&
       ((*(int *)(&this->field_0x98 + (long)p_Var32) == 1 &&
        (iVar49 = *(int *)((long)&(this->weight_sgemm_data).dims + (long)p_Var32), 0xf < iVar49)))))
      ) && (0xf < (*(int *)(&this->field_0xa8 + (long)p_Var32) / 9) / iVar49)) {
    this->use_winograd3x3 = false;
  }
  if (this->use_winograd3x3 == true) {
    p_Var32 = this->_vptr_Convolution_x86[-3];
    uVar28 = *(uint *)((long)&(this->weight_sgemm_data).dims + (long)p_Var32);
    uVar42 = (long)(*(int *)(&this->field_0xa8 + (long)p_Var32) / 9) / (long)(int)uVar28;
    uVar54 = uVar42 & 0xffffffff;
    iVar49 = (int)uVar42;
    if ((&this->field_0x1c0)[(long)p_Var32] == '\x01') {
      Mat::create(&this->weight_3x3_winograd23_data,0x24,iVar49,uVar28,2,(Allocator *)0x0);
      if (0 < (int)uVar28) {
        lVar45 = *(long *)(&this->field_0xf8 + (long)p_Var32);
        iVar53 = (this->weight_3x3_winograd23_data).w;
        local_640 = (this->weight_3x3_winograd23_data).data;
        sVar33 = (this->weight_3x3_winograd23_data).elemsize;
        sVar34 = (this->weight_3x3_winograd23_data).cstep;
        local_670 = 0;
        do {
          if (0 < iVar49) {
            lVar40 = iVar49 * 9 * (int)local_670 + lVar45;
            uVar42 = 0;
            pvVar47 = local_640;
            do {
              lVar46 = uVar42 * 9;
              cVar16 = *(char *)(lVar40 + lVar46);
              cVar17 = *(char *)(lVar40 + 1 + lVar46);
              cVar18 = *(char *)(lVar40 + 2 + lVar46);
              cVar19 = *(char *)(lVar40 + 3 + lVar46);
              cVar20 = *(char *)(lVar40 + 4 + lVar46);
              cVar21 = *(char *)(lVar40 + 5 + lVar46);
              cVar22 = *(char *)(lVar40 + 6 + lVar46);
              cVar23 = *(char *)(lVar40 + 7 + lVar46);
              cVar24 = *(char *)(lVar40 + 8 + lVar46);
              lVar46 = 4;
              do {
                sVar25 = *(short *)(&UNK_001632cc + lVar46);
                sVar26 = *(short *)(&UNK_001632ce + lVar46);
                sVar27 = *(short *)((long)&DAT_001632d0 + lVar46);
                *(short *)((long)local_5d8.params + lVar46 + -4) =
                     sVar27 * cVar18 + sVar26 * cVar17 + sVar25 * cVar16;
                *(short *)((long)local_5d8.params + lVar46 + -2) =
                     sVar27 * cVar21 + sVar26 * cVar20 + sVar25 * cVar19;
                *(short *)((long)&local_5d8.params[0].loaded + lVar46) =
                     sVar27 * cVar24 + sVar26 * cVar23 + sVar25 * cVar22;
                lVar46 = lVar46 + 6;
              } while (lVar46 != 0x28);
              lVar46 = 0;
              pvVar41 = pvVar47;
              do {
                sVar25 = *(short *)((long)&local_5d8.params[0].loaded + lVar46 * 6);
                uVar29 = *(undefined4 *)((long)&local_5d8.params[0].loaded + lVar46 * 6 + 2);
                puVar50 = &DAT_001632d2;
                lVar52 = 0;
                do {
                  *(short *)((long)pvVar41 + lVar52 * 2) =
                       (short)((uint)*puVar50 >> 0x10) * (short)((uint)uVar29 >> 0x10) +
                       (short)*puVar50 * (short)uVar29 + *(short *)((long)puVar50 + -2) * sVar25;
                  lVar52 = lVar52 + 1;
                  puVar50 = (undefined4 *)((long)puVar50 + 6);
                } while (lVar52 != 6);
                lVar46 = lVar46 + 1;
                pvVar41 = (void *)((long)pvVar41 + 0xc);
              } while (lVar46 != 6);
              uVar42 = uVar42 + 1;
              pvVar47 = (void *)((long)pvVar47 + (long)iVar53 * sVar33);
            } while (uVar42 != uVar54);
          }
          local_670 = local_670 + 1;
          local_640 = (void *)((long)local_640 + sVar34 * sVar33);
        } while (local_670 != uVar28);
      }
    }
    else {
      Mat::create(&this->weight_3x3_winograd23_data,0x24,iVar49,uVar28,4,(Allocator *)0x0);
      if (0 < (int)uVar28) {
        lVar45 = *(long *)(&this->field_0xf8 + (long)p_Var32);
        iVar53 = (this->weight_3x3_winograd23_data).w;
        pvVar47 = (this->weight_3x3_winograd23_data).data;
        sVar33 = (this->weight_3x3_winograd23_data).elemsize;
        sVar34 = (this->weight_3x3_winograd23_data).cstep;
        uVar42 = 0;
        do {
          if (0 < iVar49) {
            lVar40 = lVar45 + (long)(iVar49 * 9 * (int)uVar42) * 4;
            uVar56 = 0;
            pvVar41 = pvVar47;
            do {
              fVar1 = *(float *)(lVar40 + 0x18 + uVar56 * 0x24);
              fVar2 = *(float *)(lVar40 + 0x1c + uVar56 * 0x24);
              fVar3 = *(float *)(lVar40 + 0x20 + uVar56 * 0x24);
              fVar4 = *(float *)(lVar40 + 0x10 + uVar56 * 0x24);
              fVar5 = *(float *)(lVar40 + uVar56 * 0x24);
              fVar6 = *(float *)(lVar40 + 4 + uVar56 * 0x24);
              fVar7 = *(float *)(lVar40 + 8 + uVar56 * 0x24);
              fVar8 = *(float *)(lVar40 + 0xc + uVar56 * 0x24);
              fVar9 = *(float *)(lVar40 + 0x14 + uVar56 * 0x24);
              lVar46 = 8;
              do {
                fVar10 = *(float *)((long)&DAT_00163300 + lVar46);
                fVar59 = (float)*(undefined8 *)(&UNK_001632f8 + lVar46);
                fVar60 = (float)((ulong)*(undefined8 *)(&UNK_001632f8 + lVar46) >> 0x20);
                *(ulong *)((long)&uStack_5e0 + lVar46) =
                     CONCAT44(fVar10 * fVar9 + fVar60 * fVar4 + fVar59 * fVar8,
                              fVar10 * fVar7 + fVar59 * fVar5 + fVar60 * fVar6);
                *(float *)((long)&local_5d8.params[0].loaded + lVar46) =
                     fVar10 * fVar3 + fVar59 * fVar1 + fVar60 * fVar2;
                lVar46 = lVar46 + 0xc;
              } while (lVar46 != 0x50);
              lVar46 = 0;
              pvVar48 = pvVar41;
              do {
                fVar1 = (float)(&local_5d8.params[0].loaded)[lVar46 * 3];
                uVar15 = *(undefined8 *)(&local_5d8.params[0].field_1 + lVar46 * 3);
                puVar58 = (undefined8 *)((long)&DAT_00163300 + 4);
                lVar52 = 0;
                do {
                  *(float *)((long)pvVar48 + lVar52 * 4) =
                       (float)((ulong)*puVar58 >> 0x20) * (float)((ulong)uVar15 >> 0x20) +
                       *(float *)((long)puVar58 + -4) * fVar1 + (float)*puVar58 * (float)uVar15;
                  lVar52 = lVar52 + 1;
                  puVar58 = (undefined8 *)((long)puVar58 + 0xc);
                } while (lVar52 != 6);
                lVar46 = lVar46 + 1;
                pvVar48 = (void *)((long)pvVar48 + 0x18);
              } while (lVar46 != 6);
              uVar56 = uVar56 + 1;
              pvVar41 = (void *)((long)pvVar41 + (long)iVar53 * sVar33);
            } while (uVar56 != uVar54);
          }
          uVar42 = uVar42 + 1;
          pvVar47 = (void *)((long)pvVar47 + sVar34 * sVar33);
        } while (uVar42 != uVar28);
      }
    }
  }
  p_Var32 = this->_vptr_Convolution_x86[-3];
  if ((&this->field_0x1c0)[(long)p_Var32] == '\0') {
    iVar49 = *(int *)((long)&(this->weight_sgemm_data).w + (long)p_Var32) *
             *(int *)((long)&(this->weight_sgemm_data).h + (long)p_Var32);
    uVar42 = (long)*(int *)(&this->field_0xa8 + (long)p_Var32) / (long)iVar49;
    uVar28 = *(uint *)((long)&(this->weight_sgemm_data).dims + (long)p_Var32);
    uVar54 = (ulong)(int)uVar28;
    uVar35 = uVar28 + 7;
    if (-1 < (long)uVar54) {
      uVar35 = uVar28;
    }
    iVar53 = (int)uVar28 % 8 + 3;
    if (-1 < (int)uVar28 % 8) {
      iVar53 = (int)uVar28 % 8;
    }
    lVar45 = *(long *)(&this->field_0xf8 + (long)p_Var32);
    iVar38 = 0;
    iVar57 = (int)((long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 | uVar42 & 0xffffffff) /
                  (long)(int)uVar28);
    Mat::create(&this->weight_sgemm_data,iVar49 * 8,iVar57,
                (int)uVar28 % 4 + ((int)uVar35 >> 3) + (iVar53 >> 2),4,(Allocator *)0x0);
    uVar35 = (int)uVar28 >> 3;
    if (0 < (int)uVar35) {
      iVar51 = iVar57 * iVar49;
      pvVar47 = (this->weight_sgemm_data).data;
      sVar33 = (this->weight_sgemm_data).elemsize;
      sVar34 = (this->weight_sgemm_data).cstep;
      iVar36 = iVar57 * iVar49;
      iVar53 = iVar36 * 8;
      iVar11 = iVar36 * 7;
      iVar37 = iVar36 * 2;
      iVar12 = iVar36 * 6;
      iVar13 = iVar36 * 5;
      iVar14 = iVar36 * 3;
      iVar36 = iVar36 * 4;
      uVar42 = 0;
      iVar43 = iVar51;
      do {
        if (0 < iVar51) {
          lVar40 = 0;
          iVar44 = iVar51;
          do {
            *(undefined4 *)((long)pvVar47 + lVar40 * 8) =
                 *(undefined4 *)(lVar45 + (long)iVar38 * 4 + lVar40);
            *(undefined4 *)((long)pvVar47 + lVar40 * 8 + 4) =
                 *(undefined4 *)(lVar45 + (long)iVar43 * 4 + lVar40);
            *(undefined4 *)((long)pvVar47 + lVar40 * 8 + 8) =
                 *(undefined4 *)(lVar45 + (long)iVar37 * 4 + lVar40);
            *(undefined4 *)((long)pvVar47 + lVar40 * 8 + 0xc) =
                 *(undefined4 *)(lVar45 + (long)iVar14 * 4 + lVar40);
            *(undefined4 *)((long)pvVar47 + lVar40 * 8 + 0x10) =
                 *(undefined4 *)(lVar45 + (long)iVar36 * 4 + lVar40);
            *(undefined4 *)((long)pvVar47 + lVar40 * 8 + 0x14) =
                 *(undefined4 *)(lVar45 + (long)iVar13 * 4 + lVar40);
            *(undefined4 *)((long)pvVar47 + lVar40 * 8 + 0x18) =
                 *(undefined4 *)(lVar45 + (long)iVar12 * 4 + lVar40);
            *(undefined4 *)((long)pvVar47 + lVar40 * 8 + 0x1c) =
                 *(undefined4 *)(lVar45 + (long)iVar11 * 4 + lVar40);
            lVar40 = lVar40 + 4;
            iVar44 = iVar44 + -1;
          } while (iVar44 != 0);
        }
        uVar42 = uVar42 + 1;
        pvVar47 = (void *)((long)pvVar47 + sVar33 * sVar34);
        iVar11 = iVar11 + iVar53;
        iVar12 = iVar12 + iVar53;
        iVar13 = iVar13 + iVar53;
        iVar36 = iVar36 + iVar53;
        iVar14 = iVar14 + iVar53;
        iVar37 = iVar37 + iVar53;
        iVar43 = iVar43 + iVar53;
        iVar38 = iVar38 + iVar53;
      } while (uVar42 != uVar35);
    }
    uVar55 = uVar28 & 0xfffffff8;
    if (((uVar54 >> 2 & 1) != 0) && (iVar53 = iVar57 * iVar49, 0 < iVar53)) {
      puVar50 = (undefined4 *)
                ((long)(int)uVar35 * (this->weight_sgemm_data).cstep *
                 (this->weight_sgemm_data).elemsize + (long)(this->weight_sgemm_data).data);
      lVar40 = 0;
      do {
        *puVar50 = *(undefined4 *)(lVar45 + (long)(int)(iVar53 * uVar55) * 4 + lVar40 * 4);
        puVar50[1] = *(undefined4 *)(lVar45 + (long)(int)((uVar55 + 1) * iVar53) * 4 + lVar40 * 4);
        puVar50[2] = *(undefined4 *)(lVar45 + (long)(int)((uVar55 + 2) * iVar53) * 4 + lVar40 * 4);
        puVar50[3] = *(undefined4 *)(lVar45 + (long)(int)((uVar55 + 3) * iVar53) * 4 + lVar40 * 4);
        lVar40 = lVar40 + 1;
        puVar50 = puVar50 + 4;
      } while (iVar53 != (int)lVar40);
    }
    iVar53 = uVar55 + ((uint)(uVar54 >> 2) & 1) * 4;
    if (iVar53 < (int)uVar28) {
      iVar57 = iVar57 * iVar49;
      sVar33 = (this->weight_sgemm_data).elemsize;
      sVar34 = (this->weight_sgemm_data).cstep;
      pvVar47 = (this->weight_sgemm_data).data;
      uVar42 = (ulong)iVar53;
      iVar53 = iVar57 * iVar53;
      do {
        if (0 < iVar57) {
          uVar28 = (uint)uVar42;
          uVar55 = uVar28 + 7;
          uVar35 = uVar28 + 3;
          if (-1 < (int)uVar28) {
            uVar55 = uVar28;
            uVar35 = uVar28;
          }
          iVar38 = uVar28 - (uVar55 & 0xfffffff8);
          iVar49 = (uVar28 - (uVar55 & 0xfffffff8)) + 3;
          if (-1 < iVar38) {
            iVar49 = iVar38;
          }
          lVar40 = 0;
          do {
            *(undefined4 *)
             ((long)pvVar47 +
             lVar40 * 4 +
             (long)(int)((iVar49 >> 2) + ((int)uVar55 >> 3) + (uVar28 - (uVar35 & 0xfffffffc))) *
             sVar33 * sVar34) = *(undefined4 *)(lVar45 + (long)iVar53 * 4 + lVar40 * 4);
            lVar40 = lVar40 + 1;
          } while (iVar57 != (int)lVar40);
        }
        uVar42 = uVar42 + 1;
        iVar53 = iVar53 + iVar57;
      } while (uVar42 != uVar54);
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// min
        pd.set(1, activation_params[1]);// max
        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt_cpu);
    }

    use_winograd3x3 = false;

    if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        int num_input = weight_data_size / 9 / num_output;
        // winograd is slow on small channel count
        if(num_input >= 16 && num_output >= 16)
            use_winograd3x3 = false;
    }           

    if (use_winograd3x3)
    {
        int num_input = weight_data_size / 9 / num_output;

        if (use_int8_inference)
            // conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
            conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
        else
            // conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
            conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
    }

    if (use_int8_inference == false)
    {
        int kernel_size = kernel_w * kernel_h;
        int num_input = weight_data_size / kernel_size / num_output;

        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }       

    return 0;
}